

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
slang::CommandLine::add
          (CommandLine *this,string_view name,optional<int> *value,string_view desc,
          string_view valueName)

{
  OptionStorage storage;
  string_view valueName_00;
  string_view desc_00;
  undefined1 in_stack_ffffffffffffffbc [20];
  undefined8 in_stack_ffffffffffffffd8;
  
  desc_00._M_str = (char *)desc._M_len;
  storage.
  super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  .
  super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  ._M_u._16_4_ = 0;
  storage.
  super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  .
  super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  ._M_u._0_16_ = (undefined1  [16])valueName;
  storage.
  super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  .
  super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  .
  super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
  ._20_20_ = in_stack_ffffffffffffffbc;
  valueName_00._M_str = (char *)in_stack_ffffffffffffffd8;
  valueName_00._M_len = (size_t)value;
  desc_00._M_len = (size_t)&stack0xffffffffffffffd0;
  addInternal(this,name,storage,desc_00,valueName_00,desc._M_str._0_1_);
  std::__detail::__variant::
  __gen_vtable_impl<std::__detail::__variant::_Multi_array<void_(*)((lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_&)>,_std::integer_sequence<unsigned_long,_1UL>_>
  ::__visit_invoke((anon_class_1_0_00000001 *)&stack0xffffffffffffffcf,
                   (variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                    *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void CommandLine::add(string_view name, std::optional<int32_t>& value, string_view desc,
                      string_view valueName) {
    addInternal(name, &value, desc, valueName);
}